

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Acknowledge_PDU.cpp
# Opt level: O2

KString * __thiscall
KDIS::PDU::Acknowledge_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Acknowledge_PDU *this)

{
  ostream *poVar1;
  KINT32 Value;
  KINT32 Value_00;
  KStringStream ss;
  KString local_220;
  KString local_200;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header7::GetAsString_abi_cxx11_(&local_1c0,(Header7 *)this);
  poVar1 = std::operator<<(local_190,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"-Acknowledge PDU-\n");
  Simulation_Management_Header::GetAsString_abi_cxx11_
            (&local_1e0,&this->super_Simulation_Management_Header);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e0);
  poVar1 = std::operator<<(poVar1,"\tAcknowledge Flag:  ");
  DATA_TYPE::ENUMS::GetEnumAsStringAcknowledgeFlag_abi_cxx11_
            (&local_200,(ENUMS *)(ulong)this->m_ui16AcknowledgeFlag,Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_200);
  poVar1 = std::operator<<(poVar1,"\n\tResponse Flag:     ");
  DATA_TYPE::ENUMS::GetEnumAsStringAcknowledgeResponseFlag_abi_cxx11_
            (&local_220,(ENUMS *)(ulong)this->m_ui16ResponseFlag,Value_00);
  poVar1 = std::operator<<(poVar1,(string *)&local_220);
  poVar1 = std::operator<<(poVar1,"\n\tRequest ID:        ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Acknowledge_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Acknowledge PDU-\n"
       << Simulation_Management_Header::GetAsString()
       << "\tAcknowledge Flag:  "   << GetEnumAsStringAcknowledgeFlag( m_ui16AcknowledgeFlag )
       << "\n\tResponse Flag:     " << GetEnumAsStringAcknowledgeResponseFlag( m_ui16ResponseFlag )
       << "\n\tRequest ID:        " << m_ui32RequestID
       << "\n";

    return ss.str();
}